

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall parser::memo::any::bind<hwl::Variable>(any *this,Variable *v)

{
  bool bVar1;
  Variable *in_RSI;
  Variable *in_RDI;
  type_info *unaff_retaddr;
  Variable *__arg;
  
  __arg = in_RDI;
  type((any *)in_RSI);
  bVar1 = std::type_info::operator==(unaff_retaddr,(type_info *)__arg);
  if (bVar1) {
    hwl::Variable::operator=(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}